

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

void __thiscall
SQCompilation::SQParser::ParseTableOrClass
          (SQParser *this,TableDecl *decl,SQInteger separator,SQInteger terminator)

{
  SQInteger SVar1;
  SQInteger SVar2;
  bool bVar3;
  int iVar4;
  Id *name;
  Expr *pEVar5;
  LiteralExpr *pLVar6;
  FunctionDecl *args;
  DeclExpr *value;
  Expr *pEVar7;
  uint keys;
  int iVar8;
  long lVar9;
  int iVar10;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  do {
    lVar9 = this->_token;
    if (lVar9 == terminator) {
      Lex(this);
      (nc._p)->_depth = (nc._p)->_depth - nc._depth;
      return;
    }
    SVar1 = (this->_lex)._tokencolumn;
    SVar2 = (this->_lex)._tokenline;
    bVar3 = lVar9 == 0x142 && separator != 0x2c;
    if (bVar3) {
      Lex(this);
      lVar9 = this->_token;
    }
    keys = (uint)bVar3;
    if (lVar9 == 0x5b) {
      Lex(this);
      pEVar5 = Expression(this,SQE_RVALUE);
      Expect(this,0x5d);
      Expect(this,0x3d);
      pEVar7 = Expression(this,SQE_RVALUE);
      TableDecl::addMember(decl,pEVar5,pEVar7,keys | 2);
    }
    else if (lVar9 == 0x103) {
      if (separator != 0x2c) goto LAB_00155d92;
      pEVar5 = Expect(this,0x103);
      Expect(this,0x3a);
      pEVar7 = Expression(this,SQE_RVALUE);
      TableDecl::addMember(decl,pEVar5,pEVar7,keys | 4);
    }
    else if ((lVar9 == 0x136) || (lVar9 == 0x11d)) {
      SVar1 = (this->_lex)._tokencolumn;
      SVar2 = (this->_lex)._tokenline;
      Lex(this);
      if (lVar9 == 0x11d) {
        name = (Id *)Expect(this,0x102);
      }
      else {
        name = newNode<SQCompilation::Id,char_const*>(this,"constructor");
      }
      pLVar6 = newNode<SQCompilation::LiteralExpr,char_const*>(this,name->_id);
      iVar8 = (int)SVar2;
      *(int *)&pLVar6->field_0x8 = iVar8;
      iVar10 = (int)SVar1;
      *(int *)&pLVar6->field_0xc = iVar10;
      *(int *)&pLVar6->field_0x10 = (int)(this->_lex)._currentline;
      *(int *)&pLVar6->field_0x14 = (int)(this->_lex)._currentcolumn;
      Expect(this,0x28);
      args = CreateFunction(this,name,false,lVar9 == 0x136);
      value = newNode<SQCompilation::DeclExpr,SQCompilation::FunctionDecl*>(this,args);
      (value->super_Expr).super_Node._coordinates.lineStart = iVar8;
      (value->super_Expr).super_Node._coordinates.columnStart = iVar10;
      (value->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (value->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      TableDecl::addMember(decl,(Expr *)pLVar6,&value->super_Expr,keys);
    }
    else {
LAB_00155d92:
      pEVar5 = Expect(this,0x102);
      (pEVar5->super_Node)._coordinates.lineStart = (int)SVar2;
      (pEVar5->super_Node)._coordinates.columnStart = (int)SVar1;
      (pEVar5->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (pEVar5->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      pLVar6 = newNode<SQCompilation::LiteralExpr,char_const*>
                         (this,(char *)pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      iVar8 = (pEVar5->super_Node)._coordinates.columnStart;
      iVar10 = (pEVar5->super_Node)._coordinates.lineEnd;
      iVar4 = (pEVar5->super_Node)._coordinates.columnEnd;
      *(int *)&pLVar6->field_0x8 = (pEVar5->super_Node)._coordinates.lineStart;
      *(int *)&pLVar6->field_0xc = iVar8;
      *(int *)&pLVar6->field_0x10 = iVar10;
      *(int *)&pLVar6->field_0x14 = iVar4;
      if ((separator == 0x2c) &&
         ((((lVar9 = this->_token, lVar9 == 0x2c || (lVar9 == 0x102)) || (lVar9 == terminator)) ||
          ((lVar9 == 0x11d || (lVar9 == 0x5b)))))) {
        TableDecl::addMember(decl,(Expr *)pLVar6,pEVar5,keys);
      }
      else {
        Expect(this,0x3d);
        pEVar5 = Expression(this,SQE_RVALUE);
        TableDecl::addMember(decl,(Expr *)pLVar6,pEVar5,keys);
      }
    }
    if (this->_token == separator) {
      Lex(this);
    }
  } while( true );
}

Assistant:

void SQParser::ParseTableOrClass(TableDecl *decl, SQInteger separator, SQInteger terminator)
{
    NestingChecker nc(this);
    NewObjectType otype = separator==_SC(',') ? NOT_TABLE : NOT_CLASS;

    while(_token != terminator) {
        SQInteger l = line();
        SQInteger c = column();
        unsigned flags = 0;
        //check if is an static
        if(otype == NOT_CLASS) {
            if(_token == TK_STATIC) {
                flags |= TMF_STATIC;
                Lex();
            }
        }

        switch (_token) {
        case TK_FUNCTION:
        case TK_CONSTRUCTOR: {
            SQInteger tk = _token;
            SQInteger l = line(), c = column();
            Lex();
            Id *funcName = tk == TK_FUNCTION ? (Id *)Expect(TK_IDENTIFIER) : newNode<Id>(_SC("constructor"));
            assert(funcName);
            LiteralExpr *key = newNode<LiteralExpr>(funcName->id()); //-V522
            setCoordinates(key, l, c);
            Expect(_SC('('));
            FunctionDecl *f = CreateFunction(funcName, false, tk == TK_CONSTRUCTOR);
            DeclExpr *e = newNode<DeclExpr>(f);
            setCoordinates(e, l, c);
            decl->addMember(key, e, flags);
        }
        break;
        case _SC('['): {
            Lex();

            Expr *key = Expression(SQE_RVALUE); //-V522
            assert(key);
            Expect(_SC(']'));
            Expect(_SC('='));
            Expr *value = Expression(SQE_RVALUE);
            decl->addMember(key, value, flags | TMF_DYNAMIC_KEY);
            break;
        }
        case TK_STRING_LITERAL: //JSON
            if (otype == NOT_TABLE) { //only works for tables
                LiteralExpr *key = (LiteralExpr *)Expect(TK_STRING_LITERAL);  //-V522
                assert(key);
                Expect(_SC(':'));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags | TMF_JSON);
                break;
            }  //-V796
        default: {
            Id *id = (Id *)setCoordinates(Expect(TK_IDENTIFIER), l, c);
            assert(id);
            LiteralExpr *key = newNode<LiteralExpr>(id->id()); //-V522
            copyCoordinates(id, key);
            if ((otype == NOT_TABLE) &&
                (_token == TK_IDENTIFIER || _token == separator || _token == terminator || _token == _SC('[')
                    || _token == TK_FUNCTION)) {
                decl->addMember(key, id, flags);
            }
            else {
                Expect(_SC('='));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags);
            }
        }
        }
        if (_token == separator) Lex(); //optional comma/semicolon
    }

    Lex();
}